

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

int Abc_TtCofactorPermConfig(word *pTruth,int i,int nWords,int fSwapOnly,int fNaive)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  if (nWords == 1) {
    iVar1 = Abc_Tt6CofactorPermNaive(pTruth,i,fSwapOnly);
    return iVar1;
  }
  if (fNaive != 0) {
    iVar1 = Abc_TtCofactorPermNaive(pTruth,i,nWords,fSwapOnly);
    return iVar1;
  }
  if (fSwapOnly != 0) {
    iVar1 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,2);
    if (iVar1 < 0) {
      Abc_TtSwapAdjacent(pTruth,nWords,i);
      return 4;
    }
    return 0;
  }
  iVar2 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,0,1);
  iVar3 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,2,3);
  iVar1 = i;
  if (iVar3 < 0) {
    if (iVar2 < 0) {
      iVar3 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,0,2);
      if (iVar3 == 0) {
        uVar5 = 1;
        uVar4 = 3;
        iVar1 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,3);
        Abc_TtFlip(pTruth,nWords,i);
        goto joined_r0x00407ad9;
      }
      uVar4 = 1;
      if (iVar3 == -1) goto LAB_00407a84;
    }
    else {
      uVar5 = 2;
      iVar3 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,2);
      uVar4 = 1;
      if (iVar3 < 1) {
        if (iVar3 != 0) {
          Abc_TtFlip(pTruth,nWords,i + 1);
          uVar4 = 3;
          iVar3 = iVar2;
          goto joined_r0x00407a1d;
        }
LAB_00407a84:
        Abc_TtFlip(pTruth,nWords,i);
        iVar1 = i + 1;
        uVar4 = 3;
      }
    }
  }
  else if (iVar2 < 0) {
    uVar5 = 0;
    iVar2 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,0,3);
    if (iVar2 < 0) {
      Abc_TtFlip(pTruth,nWords,i);
      iVar1 = i + 1;
      uVar4 = 3;
    }
    else {
      uVar4 = 1;
joined_r0x00407a1d:
      if (iVar3 != 0) goto LAB_00407aee;
    }
  }
  else {
    iVar1 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,3);
    if (iVar1 < 0) {
      iVar1 = i + 1;
      uVar4 = 2;
    }
    else {
      uVar5 = 0;
      if (iVar1 != 0) goto LAB_00407aee;
      uVar5 = 0;
      uVar4 = 2;
      iVar1 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,0,2);
joined_r0x00407ad9:
      if (-1 < iVar1) goto LAB_00407aee;
      iVar1 = i + 1;
    }
  }
  uVar5 = uVar4;
  Abc_TtFlip(pTruth,nWords,iVar1);
LAB_00407aee:
  iVar1 = Abc_TtCompare2VarCofsRev(pTruth,nWords,i,1,2);
  if (iVar1 < 0) {
    Abc_TtSwapAdjacent(pTruth,nWords,i);
    uVar5 = uVar5 | 4;
  }
  return uVar5;
}

Assistant:

int Abc_TtCofactorPermConfig( word * pTruth, int i, int nWords, int fSwapOnly, int fNaive )
{
    if ( nWords == 1 )
        return Abc_Tt6CofactorPermNaive( pTruth, i, fSwapOnly );
    if ( fNaive )
        return Abc_TtCofactorPermNaive( pTruth, i, nWords, fSwapOnly );
    if ( fSwapOnly )
    {
        if ( Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 2 ) < 0 ) // Cof1 < Cof2
        {
            Abc_TtSwapAdjacent( pTruth, nWords, i );
            return 4;
        }
        return 0;
    }
    {  
        int fComp01, fComp02, fComp03, fComp12, fComp13, fComp23, Config = 0;
        fComp01 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 0, 1 );
        fComp23 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 2, 3 );
        if ( fComp23 >= 0 ) // Cof2 >= Cof3 
        {
            if ( fComp01 >= 0 ) // Cof0 >= Cof1
            {
                fComp13 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 3 );
                if ( fComp13 < 0 ) // Cof1 < Cof3 
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 2;
                else if ( fComp13 == 0 ) // Cof1 == Cof3 
                {
                    fComp02 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 0, 2 );
                    if ( fComp02 < 0 )
                        Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 2;
                }
                // else   Cof1 > Cof3 -- do nothing
            }
            else // Cof0 < Cof1
            {
                fComp03 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 0, 3 );
                if ( fComp03 < 0 ) // Cof0 < Cof3
                {
                    Abc_TtFlip( pTruth, nWords, i );
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 3;
                }
                else //  Cof0 >= Cof3
                {
                    if ( fComp23 == 0 ) // can flip Cof0 and Cof1
                        Abc_TtFlip( pTruth, nWords, i ), Config = 1;
                }
            }
        }
        else // Cof2 < Cof3 
        {
            if ( fComp01 >= 0 ) // Cof0 >= Cof1
            {
                fComp12 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 2 );
                if ( fComp12 > 0 ) // Cof1 > Cof2 
                    Abc_TtFlip( pTruth, nWords, i ), Config = 1;
                else if ( fComp12 == 0 ) // Cof1 == Cof2 
                {
                    Abc_TtFlip( pTruth, nWords, i );
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 3;
                }
                else // Cof1 < Cof2
                {
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 2;
                    if ( fComp01 == 0 )
                        Abc_TtFlip( pTruth, nWords, i ), Config ^= 1;
                }
            }
            else // Cof0 < Cof1
            {
                fComp02 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 0, 2 );
                if ( fComp02 == -1 ) // Cof0 < Cof2 
                {
                    Abc_TtFlip( pTruth, nWords, i );
                    Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 3;
                }
                else if ( fComp02 == 0 ) // Cof0 == Cof2
                {
                    fComp13 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 3 );
                    if ( fComp13 >= 0 ) // Cof1 >= Cof3 
                        Abc_TtFlip( pTruth, nWords, i ), Config = 1;
                    else // Cof1 < Cof3 
                    {
                        Abc_TtFlip( pTruth, nWords, i );
                        Abc_TtFlip( pTruth, nWords, i + 1 ), Config = 3;
                    }
                }
                else // Cof0 > Cof2
                    Abc_TtFlip( pTruth, nWords, i ), Config = 1;
            }
        }
        // perform final swap if needed
        fComp12 = Abc_TtCompare2VarCofsRev( pTruth, nWords, i, 1, 2 );
        if ( fComp12 < 0 ) // Cof1 < Cof2
            Abc_TtSwapAdjacent( pTruth, nWords, i ), Config ^= 4;
        return Config;
    }
}